

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

int encrypt_ticket_cb(ptls_encrypt_ticket_t *_self,ptls_t *tls,int is_encrypt,ptls_buffer_t *dst,
                     ptls_iovec_t src)

{
  uint8_t *puVar1;
  _func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *p_Var2;
  _func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *p_Var3;
  int iVar4;
  _func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *p_Var5;
  ptls_context_t *ppVar6;
  _func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *p_Var7;
  
  p_Var7 = (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *)
           src.len;
  if (is_encrypt == 0) {
    if (p_Var7 != (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t
                   *)0x20) {
      return 0x205;
    }
    if (*(undefined1 (*) [32])(_self + 1) != *(undefined1 (*) [32])src.base) {
      return 0x205;
    }
    iVar4 = ptls_buffer_reserve(dst,(size_t)_self[6].cb);
    if (iVar4 != 0) {
      return iVar4;
    }
    memcpy(dst->base + dst->off,_self[5].cb,(size_t)_self[6].cb);
    p_Var5 = _self[6].cb;
  }
  else {
    free(_self[5].cb);
    p_Var5 = (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *
             )malloc((size_t)p_Var7);
    _self[5].cb = p_Var5;
    if (p_Var5 == (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t
                   *)0x0) {
      return 0x201;
    }
    ppVar6 = ptls_get_context(tls);
    p_Var5 = (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *
             )0x20;
    (*ppVar6->random_bytes)(_self + 1,0x20);
    memcpy(_self[5].cb,(undefined1 (*) [32])src.base,(size_t)p_Var7);
    _self[6].cb = p_Var7;
    iVar4 = ptls_buffer_reserve(dst,0x20);
    if (iVar4 != 0) {
      return iVar4;
    }
    p_Var7 = _self[2].cb;
    p_Var2 = _self[3].cb;
    p_Var3 = _self[4].cb;
    puVar1 = dst->base + dst->off;
    *(_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t **)puVar1
         = _self[1].cb;
    *(_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t **)
     (puVar1 + 8) = p_Var7;
    *(_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t **)
     (puVar1 + 0x10) = p_Var2;
    *(_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t **)
     (puVar1 + 0x18) = p_Var3;
  }
  dst->off = (size_t)(p_Var5 + dst->off);
  return 0;
}

Assistant:

static int encrypt_ticket_cb(ptls_encrypt_ticket_t *_self, ptls_t *tls, int is_encrypt, ptls_buffer_t *dst, ptls_iovec_t src)
{
    struct st_util_session_cache_t *self = (void *)_self;
    int ret;

    if (is_encrypt) {

        /* replace the cached entry along with a newly generated session id */
        free(self->data.base);
        if ((self->data.base = malloc(src.len)) == NULL)
            return PTLS_ERROR_NO_MEMORY;

        ptls_get_context(tls)->random_bytes(self->id, sizeof(self->id));
        memcpy(self->data.base, src.base, src.len);
        self->data.len = src.len;

        /* store the session id in buffer */
        if ((ret = ptls_buffer_reserve(dst, sizeof(self->id))) != 0)
            return ret;
        memcpy(dst->base + dst->off, self->id, sizeof(self->id));
        dst->off += sizeof(self->id);

    } else {

        /* check if session id is the one stored in cache */
        if (src.len != sizeof(self->id))
            return PTLS_ERROR_SESSION_NOT_FOUND;
        if (memcmp(self->id, src.base, sizeof(self->id)) != 0)
            return PTLS_ERROR_SESSION_NOT_FOUND;

        /* return the cached value */
        if ((ret = ptls_buffer_reserve(dst, self->data.len)) != 0)
            return ret;
        memcpy(dst->base + dst->off, self->data.base, self->data.len);
        dst->off += self->data.len;
    }

    return 0;
}